

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall TimerTest_scoped_Test::TestBody(TimerTest_scoped_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d8 [8];
  Message local_d0 [8];
  future_status local_c8 [2];
  duration<long,_std::ratio<1L,_1000000000L>_> local_c0;
  promise<void> local_b8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  anon_class_24_3_a4f8476d local_80;
  function<void_(jessilib::timer_&)> local_68;
  undefined8 local_48;
  undefined1 local_40 [8];
  timer timer_obj;
  promise<void> promise;
  size_t iterations;
  TimerTest_scoped_Test *this_local;
  
  promise._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter,_true,_true>
        )(__uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
          )0x0;
  this_00 = &timer_obj.m_context.
             super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::promise<void>::promise((promise<void> *)this_00);
  local_48 = 1000000;
  local_80.iterations = (size_t *)&promise._M_storage;
  local_80.timer_obj = (timer *)local_40;
  local_80.promise = (promise<void> *)this_00;
  std::function<void(jessilib::timer&)>::function<TimerTest_scoped_Test::TestBody()::__0,void>
            ((function<void(jessilib::timer&)> *)&local_68,&local_80);
  jessilib::timer::timer((timer *)local_40,local_48,&local_68);
  std::function<void_(jessilib::timer_&)>::~function(&local_68);
  std::promise<void>::get_future(&local_b8);
  local_c8[1] = 100000;
  local_c0 = std::chrono::operator*(&timeout,(int *)(local_c8 + 1));
  local_b8._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._4_4_ =
       std::__basic_future<void>::wait_for<long,std::ratio<1l,1000000000l>>
                 ((__basic_future<void> *)&local_b8,&local_c0);
  local_c8[0] = ready;
  testing::internal::EqHelper::Compare<std::future_status,_std::future_status,_nullptr>
            ((EqHelper *)local_a0,"promise.get_future().wait_for(timeout * 100000)",
             "std::future_status::ready",
             (future_status *)
             ((long)&local_b8._M_storage._M_t.
                     super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
             + 4),local_c8);
  std::future<void>::~future((future<void> *)&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  jessilib::timer::~timer((timer *)local_40);
  std::promise<void>::~promise
            ((promise<void> *)
             &timer_obj.m_context.
              super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(TimerTest, scoped) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	timer timer_obj{ period, [&iterations, &promise, &timer_obj](timer& in_timer) {
		EXPECT_EQ(timer_obj, in_timer);

		if (++iterations == total_iterations) {
			promise.set_value();
			in_timer.cancel();
		}
	} };

	EXPECT_EQ(promise.get_future().wait_for(timeout * 100000), std::future_status::ready);
}